

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

pair<int,_int> __thiscall Game::calculateLastRoundPoints(Game *this,Round *r,bool lastRound)

{
  size_type player2;
  bool bVar1;
  CardValue CVar2;
  Suit SVar3;
  const_reference pvVar4;
  undefined7 in_register_00000011;
  size_t j;
  ulong __n;
  size_t player1;
  uint uVar5;
  Card playedCard;
  Card cj;
  value_type local_68;
  undefined4 local_60;
  int local_5c;
  Card local_58;
  long local_50;
  ulong local_48;
  Ruleset *local_40;
  size_t local_38;
  
  local_60 = (undefined4)CONCAT71(in_register_00000011,lastRound);
  player2 = r->m_winner;
  local_38 = r->startPosition;
  local_40 = &this->m_rules;
  local_48 = 0;
  uVar5 = 0;
  for (local_50 = 0; local_50 != 4; local_50 = local_50 + 1) {
    __n = (ulong)((int)local_50 + (int)local_38 & 3);
    pvVar4 = std::vector<Card,_std::allocator<Card>_>::at(&r->m_playedCards,__n);
    local_68 = *pvVar4;
    local_5c = Ruleset::getValue(local_40,&local_68);
    CVar2 = Card::value(&local_68);
    if (CVar2 == ASS) {
      SVar3 = Card::suit(&local_68);
      if (SVar3 == DIAMONDS) {
        bVar1 = teamMembers(this,__n,player2);
        uVar5 = uVar5 + !bVar1;
      }
    }
    if ((char)local_60 != '\0') {
      local_58.m_suit = CLUBS;
      local_58.m_value = JACK;
      pvVar4 = std::vector<Card,_std::allocator<Card>_>::at(&r->m_playedCards,player2);
      bVar1 = Card::operator==(pvVar4,&local_58);
      uVar5 = uVar5 + bVar1;
      for (player1 = 0; player1 != 4; player1 = player1 + 1) {
        bVar1 = teamMembers(this,player1,player2);
        if (!bVar1) {
          pvVar4 = std::vector<Card,_std::allocator<Card>_>::at(&r->m_playedCards,player1);
          bVar1 = Card::operator==(pvVar4,&local_58);
          uVar5 = uVar5 + bVar1;
        }
      }
    }
    local_48 = (ulong)(uint)((int)local_48 + local_5c);
  }
  return (pair<int,_int>)(local_48 | (ulong)uVar5 << 0x20);
}

Assistant:

std::pair<int, int> Game::calculateLastRoundPoints(Round r, bool lastRound) {
    size_t startingPlayer = r.getStartPosition();
    size_t winner = r.getWinner();

    int rawCardPoints = 0;
    int gamePoints = 0;
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        size_t playerID = (i + startingPlayer) % NUMPLAYERS;
        Card playedCard = r.playedCards().at(playerID);
        rawCardPoints += m_rules.getValue(playedCard);

        //Catch fox
        if (playedCard.value() == CardValue::ASS && playedCard.suit() == Suit::DIAMONDS) {
            if (!teamMembers(playerID, winner))
                ++gamePoints;
        }
        //Catch CJ and win with it
        if (lastRound) {
            Card cj = Card(Suit::CLUBS, CardValue::JACK);
            if (r.playedCards().at(winner) == cj) //win with it
                ++gamePoints;
            for (size_t j = 0; j < NUMPLAYERS; j++) { //catch it
                if (!teamMembers(j, winner)) {
                    if (r.playedCards().at(j) == cj)
                        ++gamePoints;
                }
            }
        }

    }
    return std::pair<int, int>(rawCardPoints, gamePoints);

}